

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_common.cpp
# Opt level: O0

void __thiscall
cfdcapi_common_CfdGetLastErrorMessage_Test::TestBody
          (cfdcapi_common_CfdGetLastErrorMessage_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_2;
  void *handle;
  AssertionResult gtest_ar_1;
  char *str_buffer;
  AssertionResult gtest_ar;
  int ret;
  exception *in_stack_fffffffffffffb88;
  CfdException *in_stack_fffffffffffffb90;
  CfdException *in_stack_fffffffffffffb98;
  AssertionResult *pAVar4;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 in_stack_fffffffffffffba7;
  void **in_stack_fffffffffffffba8;
  CfdException *in_stack_fffffffffffffbb0;
  void *in_stack_fffffffffffffbc8;
  char **in_stack_fffffffffffffc20;
  undefined7 in_stack_fffffffffffffc28;
  undefined1 in_stack_fffffffffffffc2f;
  AssertHelper local_2f0;
  Message local_2e8;
  undefined4 local_2dc;
  AssertionResult local_2d8;
  AssertHelper local_2c8;
  Message local_2c0;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  AssertionResult local_290;
  AssertHelper local_280;
  Message local_278;
  undefined4 local_26c;
  AssertionResult local_268;
  runtime_error local_258 [16];
  AssertHelper local_248;
  Message local_240;
  AssertionResult local_238;
  AssertHelper local_228;
  Message local_220;
  undefined4 local_214;
  AssertionResult local_210;
  AssertHelper local_200;
  Message local_1f8;
  undefined4 local_1ec;
  AssertionResult local_1e8;
  allocator local_1d1;
  string local_1d0 [80];
  AssertHelper local_180;
  Message local_178;
  AssertionResult local_170;
  AssertHelper local_160;
  Message local_158;
  undefined4 local_14c;
  AssertionResult local_148;
  AssertHelper local_138;
  Message local_130;
  AssertionResult local_128;
  AssertHelper local_118;
  Message local_110;
  undefined4 local_104;
  AssertionResult local_100;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_b9;
  AssertionResult local_b8;
  AssertHelper local_a8;
  Message local_a0;
  undefined4 local_94;
  AssertionResult local_90;
  long local_80;
  AssertHelper local_78;
  Message local_70;
  undefined4 local_64;
  AssertionResult local_60;
  char *local_50;
  AssertHelper local_48;
  Message local_40 [3];
  undefined4 local_24;
  AssertionResult local_20;
  int local_c;
  
  local_c = CfdGetLastErrorMessage
                      ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
  local_24 = 1;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_20);
  if (!bVar1) {
    testing::Message::Message(local_40);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31f0ed);
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x80,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::Message::~Message((Message *)0x31f150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31f1a8);
  local_50 = (char *)0x0;
  local_c = CfdGetLastErrorMessage
                      ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
  local_64 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!bVar1) {
    testing::Message::Message(&local_70);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31f279);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x84,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x31f2dc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31f334);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
  local_50 = (char *)0x0;
  local_80 = 0;
  local_c = CfdCreateHandle(in_stack_fffffffffffffba8);
  local_94 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_90);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31f41a);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message((Message *)0x31f47d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31f4d2);
  local_b9 = local_80 != 0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffffb90,(bool *)in_stack_fffffffffffffb88,
             (type *)0x31f506);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)&local_b8,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message((Message *)0x31f602);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31f67d);
  local_c = CfdGetLastErrorMessage
                      ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
  local_104 = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
  if (!bVar1) {
    testing::Message::Message(&local_110);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31f746);
    testing::internal::AssertHelper::AssertHelper
              (&local_118,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_118,&local_110);
    testing::internal::AssertHelper::~AssertHelper(&local_118);
    testing::Message::~Message((Message *)0x31f7a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31f7fe);
  testing::internal::CmpHelperSTREQ((internal *)&local_128,"\"\"","str_buffer","",local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message(&local_130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31f89f);
    testing::internal::AssertHelper::AssertHelper
              (&local_138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x8f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_138,&local_130);
    testing::internal::AssertHelper::~AssertHelper(&local_138);
    testing::Message::~Message((Message *)0x31f902);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31f95a);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
  local_50 = (char *)0x0;
  cfd::capi::SetLastFatalError
            (in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  local_c = CfdGetLastErrorMessage
                      ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
  local_14c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
  if (!bVar1) {
    testing::Message::Message(&local_158);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31fa50);
    testing::internal::AssertHelper::AssertHelper
              (&local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x95,pcVar3);
    testing::internal::AssertHelper::operator=(&local_160,&local_158);
    testing::internal::AssertHelper::~AssertHelper(&local_160);
    testing::Message::~Message((Message *)0x31fab3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31fb08);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_170,"\"dummy\"","str_buffer","dummy",local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_170);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31fba9);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x96,pcVar3);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message((Message *)0x31fc0c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31fc64);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
  local_50 = (char *)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"dummy_cfdexcept",&local_1d1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffbb0,(CfdError)((ulong)in_stack_fffffffffffffba8 >> 0x20),
             (string *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0));
  cfd::capi::SetLastError
            ((void *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             in_stack_fffffffffffffb98);
  cfd::core::CfdException::~CfdException(in_stack_fffffffffffffb90);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  local_c = CfdGetLastErrorMessage
                      ((void *)CONCAT17(in_stack_fffffffffffffc2f,in_stack_fffffffffffffc28),
                       in_stack_fffffffffffffc20);
  local_1ec = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31fe52);
    testing::internal::AssertHelper::AssertHelper
              (&local_200,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0x9e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_200,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper(&local_200);
    testing::Message::~Message((Message *)0x31feb5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x31ff0d);
  local_c = CfdGetLastErrorCode(in_stack_fffffffffffffbc8);
  local_214 = 0xfffffffe;
  pAVar4 = &local_210;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_220);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x31ffce);
    testing::internal::AssertHelper::AssertHelper
              (&local_228,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_228,&local_220);
    testing::internal::AssertHelper::~AssertHelper(&local_228);
    testing::Message::~Message((Message *)0x320031);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x320086);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_238,"\"dummy_cfdexcept\"","str_buffer","dummy_cfdexcept",local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_238);
  if (!bVar1) {
    testing::Message::Message(&local_240);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x320127);
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_248,&local_240);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    testing::Message::~Message((Message *)0x320184);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3201dc);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
  local_50 = (char *)0x0;
  std::runtime_error::runtime_error(local_258,"dummy_except");
  cfd::capi::SetLastFatalError(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::runtime_error::~runtime_error(local_258);
  local_c = CfdGetLastErrorMessage
                      ((void *)CONCAT17(uVar2,in_stack_fffffffffffffc28),(char **)pAVar4);
  local_26c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x32031c);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa7,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    testing::Message::~Message((Message *)0x320379);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3203ce);
  local_c = CfdGetLastErrorCode(in_stack_fffffffffffffbc8);
  local_294 = 0xffffffff;
  pAVar4 = &local_290;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)in_stack_fffffffffffffb98,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x320483);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xa9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message((Message *)0x3204e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x320535);
  pAVar4 = &local_2b8;
  testing::internal::CmpHelperSTREQ
            ((internal *)pAVar4,"\"dummy_except\"","str_buffer","dummy_except",local_50);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_2c0);
    in_stack_fffffffffffffba8 =
         (void **)testing::AssertionResult::failure_message((AssertionResult *)0x3205ca);
    testing::internal::AssertHelper::AssertHelper
              (&local_2c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xaa,(char *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::operator=(&local_2c8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2c8);
    testing::Message::~Message((Message *)0x320627);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x32067f);
  CfdFreeStringBuffer((char *)in_stack_fffffffffffffb98);
  local_50 = (char *)0x0;
  local_c = CfdFreeHandle(in_stack_fffffffffffffb98);
  local_2dc = 0;
  pAVar4 = &local_2d8;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)in_stack_fffffffffffffba8,
             (char *)CONCAT17(in_stack_fffffffffffffba7,in_stack_fffffffffffffba0),
             (CfdErrorCode *)pAVar4,(int *)in_stack_fffffffffffffb90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(pAVar4);
  if (!bVar1) {
    testing::Message::Message(&local_2e8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x32074d);
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/capi/test_cfdcapi_common.cpp"
               ,0xaf,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2f0,&local_2e8);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    testing::Message::~Message((Message *)0x3207aa);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3207ff);
  return;
}

Assistant:

TEST(cfdcapi_common, CfdGetLastErrorMessage) {
  int ret = CfdGetLastErrorMessage(NULL, NULL);
  EXPECT_EQ(kCfdIllegalArgumentError, ret);

  char* str_buffer = NULL;
  ret = CfdGetLastErrorMessage(NULL, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  void* handle = NULL;
  ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_STREQ("", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastFatalError(handle, "dummy");
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_STREQ("dummy", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastError(handle,
    cfd::core::CfdException(cfd::core::CfdError::kCfdInternalError,
      "dummy_cfdexcept"));
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdInternalError, ret);
  EXPECT_STREQ("dummy_cfdexcept", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  cfd::capi::SetLastFatalError(handle, std::runtime_error("dummy_except"));
  ret = CfdGetLastErrorMessage(handle, &str_buffer);
  EXPECT_EQ(kCfdSuccess, ret);
  ret = CfdGetLastErrorCode(handle);
  EXPECT_EQ(kCfdUnknownError, ret);
  EXPECT_STREQ("dummy_except", str_buffer);
  CfdFreeStringBuffer(str_buffer);
  str_buffer = NULL;

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}